

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O2

void __thiscall fat::get_cluster_content(fat *this,int32_t cluster)

{
  int iVar1;
  int iVar2;
  int32_t *piVar3;
  reference pvVar4;
  size_type __n;
  
  piVar3 = this->fat_table;
  while( true ) {
    __n = (size_type)cluster;
    iVar1 = piVar3[__n];
    iVar2 = this->FAT_FILE_END;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->cluster_data,__n);
    std::operator<<((ostream *)&std::cout,(string *)pvVar4);
    if (iVar1 == iVar2) break;
    piVar3 = this->fat_table;
    cluster = piVar3[__n];
  }
  return;
}

Assistant:

void fat::get_cluster_content(int32_t cluster) {
    //pokud je prazdny (tedy zacina 0, tak nevypisuj obsah)
    if (fat_table[cluster] == FAT_FILE_END) {
        std::cout << cluster_data.at(cluster);
    } else {
        std::cout << cluster_data.at(cluster);
        get_cluster_content(fat_table[cluster]);
    }
}